

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O3

string * amrex::trim(string *__return_storage_ptr__,string *s,string *space)

{
  pointer pcVar1;
  undefined8 uVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *psVar5;
  long *local_40 [2];
  long local_30 [2];
  
  lVar3 = std::__cxx11::string::find_first_not_of((char *)s,(ulong)(space->_M_dataplus)._M_p,0);
  if (lVar3 == -1) {
    paVar4 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
    psVar5 = &__return_storage_ptr__->_M_string_length;
  }
  else {
    std::__cxx11::string::find_last_not_of
              ((char *)s,(ulong)(space->_M_dataplus)._M_p,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_40,(ulong)s);
    std::__cxx11::string::operator=((string *)s,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    paVar4 = &s->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&s->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    psVar5 = &s->_M_string_length;
    __return_storage_ptr__->_M_string_length = s->_M_string_length;
    (s->_M_dataplus)._M_p = (pointer)paVar4;
  }
  *psVar5 = 0;
  paVar4->_M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
amrex::trim(std::string s, std::string const& space)
{
    const auto sbegin = s.find_first_not_of(space);
    if (sbegin == std::string::npos) return std::string{};
    const auto send = s.find_last_not_of(space);
    s = s.substr(sbegin, send-sbegin+1);
    return s;
}